

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O0

int __thiscall FIX::DateTime::getFraction(DateTime *this,int precision)

{
  uint uVar1;
  int precision_local;
  DateTime *this_local;
  
  switch(precision) {
  case 0:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 1000000000;
    break;
  case 1:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 100000000;
    break;
  case 2:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 10000000;
    break;
  case 3:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 1000000;
    break;
  case 4:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 100000;
    break;
  case 5:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 10000;
    break;
  case 6:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 1000;
    break;
  case 7:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 100;
    break;
  case 8:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 10;
    break;
  case 9:
  default:
    uVar1 = getNanosecond(this);
    this_local._4_4_ = uVar1 / 1;
  }
  return this_local._4_4_;
}

Assistant:

inline int getFraction(int precision) const {
    switch (precision) {
    case 0:
      return (getNanosecond() / PRECISION_FACTOR[0]);

    case 1:
      return (getNanosecond() / PRECISION_FACTOR[1]);

    case 2:
      return (getNanosecond() / PRECISION_FACTOR[2]);

    case 3:
      return (getNanosecond() / PRECISION_FACTOR[3]);

    case 4:
      return (getNanosecond() / PRECISION_FACTOR[4]);

    case 5:
      return (getNanosecond() / PRECISION_FACTOR[5]);

    case 6:
      return (getNanosecond() / PRECISION_FACTOR[6]);

    case 7:
      return (getNanosecond() / PRECISION_FACTOR[7]);

    case 8:
      return (getNanosecond() / PRECISION_FACTOR[8]);

    case 9:
    default:
      return (getNanosecond() / PRECISION_FACTOR[9]);
    }
  }